

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O0

qint64 __thiscall QFileDevice::readLineData(QFileDevice *this,char *data,qint64 maxlen)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  QFileDevicePrivate *pQVar4;
  pointer pQVar5;
  undefined4 extraout_var;
  long in_RDX;
  undefined8 in_RSI;
  QFileDevicePrivate *in_RDI;
  char *unaff_retaddr;
  qint64 read;
  QFileDevicePrivate *d;
  long local_30;
  qint64 in_stack_fffffffffffffff8;
  
  pQVar4 = d_func((QFileDevice *)0x124af5);
  bVar1 = QFileDevicePrivate::ensureFlushed(in_RDI);
  if (bVar1) {
    pQVar5 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x124b36);
    uVar2 = (*pQVar5->_vptr_QAbstractFileEngine[0x27])(pQVar5,1);
    if ((uVar2 & 1) == 0) {
      local_30 = QIODevice::readLineData((QIODevice *)read,unaff_retaddr,in_stack_fffffffffffffff8);
    }
    else {
      pQVar5 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x124b5e);
      iVar3 = (*pQVar5->_vptr_QAbstractFileEngine[0x24])(pQVar5,in_RSI,in_RDX);
      local_30 = CONCAT44(extraout_var,iVar3);
    }
    if (local_30 < in_RDX) {
      pQVar4->cachedSize = 0;
    }
  }
  else {
    local_30 = -1;
  }
  return local_30;
}

Assistant:

qint64 QFileDevice::readLineData(char *data, qint64 maxlen)
{
    Q_D(QFileDevice);
    if (!d->ensureFlushed())
        return -1;

    qint64 read;
    if (d->fileEngine->supportsExtension(QAbstractFileEngine::FastReadLineExtension)) {
        read = d->fileEngine->readLine(data, maxlen);
    } else {
        // Fall back to QIODevice's readLine implementation if the engine
        // cannot do it faster.
        read = QIODevice::readLineData(data, maxlen);
    }

    if (read < maxlen) {
        // failed to read all requested, may be at the end of file, stop caching size so that it's rechecked
        d->cachedSize = 0;
    }

    return read;
}